

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O1

size_t c4::base64_decode(c4 *param_1,char *param_2,size_t param_3,ulong param_4)

{
  char cVar1;
  char cVar2;
  char cVar3;
  bool bVar4;
  uint uVar5;
  char *pcVar6;
  ulong uVar7;
  ulong uVar8;
  c4 *pcVar9;
  uint uVar10;
  csubstr encoded;
  
  encoded.len = param_3;
  encoded.str = param_2;
  bVar4 = base64_valid(param_1,encoded);
  if (!bVar4) {
    base64_decode();
  }
  if (((ulong)param_2 & 3) != 0) {
    base64_decode();
  }
  if (param_2 == (char *)0x0) {
    uVar8 = 0;
    pcVar9 = param_1;
  }
  else {
    pcVar6 = (char *)0x0;
    uVar8 = 2;
    do {
      uVar7 = uVar8;
      uVar8 = uVar7 - 2;
      if (((param_1 + 2)[(long)pcVar6] == (c4)0x3d) || ((param_1 + 3)[(long)pcVar6] == (c4)0x3d)) {
        pcVar9 = param_1 + (long)pcVar6;
        if (param_2 + -4 != pcVar6) {
          base64_decode();
        }
        goto LAB_001bb502;
      }
      if ((char)(param_1 + 3)[(long)pcVar6] < '\0') {
        base64_decode();
      }
      if ((char)(param_1 + 3)[(long)pcVar6] < '\0') {
        base64_decode();
      }
      cVar1 = (&detail::base64_char_to_sextet_)[(char)(param_1 + 3)[(long)pcVar6]];
      if ((char)(param_1 + 2)[(long)pcVar6] < '\0') {
        base64_decode();
      }
      if ((char)(param_1 + 2)[(long)pcVar6] < '\0') {
        base64_decode();
      }
      cVar2 = (&detail::base64_char_to_sextet_)[(char)(param_1 + 2)[(long)pcVar6]];
      if ((char)(param_1 + 1)[(long)pcVar6] < '\0') {
        base64_decode();
      }
      if ((char)(param_1 + 1)[(long)pcVar6] < '\0') {
        base64_decode();
      }
      cVar3 = (&detail::base64_char_to_sextet_)[(char)(param_1 + 1)[(long)pcVar6]];
      if ((char)param_1[(long)pcVar6] < '\0') {
        base64_decode();
      }
      if ((char)param_1[(long)pcVar6] < '\0') {
        base64_decode();
      }
      uVar10 = (int)cVar2 << 6 | (int)cVar1;
      uVar5 = (int)cVar3 << 0xc | uVar10;
      if (uVar8 < param_4) {
        *(byte *)((param_3 - 2) + uVar7) =
             (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[(char)param_1[(long)pcVar6]] <<
                    0x12) >> 0x10) | (byte)(uVar5 >> 0x10);
      }
      if (uVar7 - 1 < param_4) {
        *(char *)((param_3 - 1) + uVar7) = (char)(uVar5 >> 8);
      }
      if (uVar7 < param_4) {
        *(char *)(param_3 + uVar7) = (char)uVar10;
      }
      pcVar6 = pcVar6 + 4;
      uVar8 = uVar7 + 3;
    } while (pcVar6 < param_2);
    uVar8 = uVar7 + 1;
    pcVar9 = (c4 *)(pcVar6 + (long)param_1);
  }
LAB_001bb502:
  param_1 = param_1 + (long)param_2;
  if (pcVar9 != param_1) {
    if (pcVar9[2] == (c4)0x3d) {
      if (pcVar9 + 4 != param_1) {
        base64_decode();
      }
      if (pcVar9[3] != (c4)0x3d) {
        base64_decode();
      }
      if ((char)pcVar9[1] < '\0') {
        base64_decode();
      }
      if ((char)pcVar9[1] < '\0') {
        base64_decode();
      }
      cVar1 = (&detail::base64_char_to_sextet_)[(char)pcVar9[1]];
      if ((char)*pcVar9 < '\0') {
        base64_decode();
      }
      if ((char)*pcVar9 < '\0') {
        base64_decode();
      }
      if (uVar8 < param_4) {
        *(byte *)(param_3 + uVar8) =
             (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[(char)*pcVar9] << 0x12) >> 0x10)
             | (byte)((uint)((int)cVar1 << 0xc) >> 0x10);
      }
      uVar8 = uVar8 + 1;
    }
    else if (pcVar9[3] == (c4)0x3d) {
      if (pcVar9 + 4 != param_1) {
        base64_decode();
      }
      if ((char)pcVar9[2] < '\0') {
        base64_decode();
      }
      if ((char)pcVar9[2] < '\0') {
        base64_decode();
      }
      cVar1 = (&detail::base64_char_to_sextet_)[(char)pcVar9[2]];
      if ((char)pcVar9[1] < '\0') {
        base64_decode();
      }
      if ((char)pcVar9[1] < '\0') {
        base64_decode();
      }
      cVar2 = (&detail::base64_char_to_sextet_)[(char)pcVar9[1]];
      if ((char)*pcVar9 < '\0') {
        base64_decode();
      }
      if ((char)*pcVar9 < '\0') {
        base64_decode();
      }
      uVar5 = (int)cVar2 << 0xc | (int)cVar1 << 6;
      if (uVar8 < param_4) {
        *(byte *)(param_3 + uVar8) =
             (byte)(((uint)(byte)(&detail::base64_char_to_sextet_)[(char)*pcVar9] << 0x12) >> 0x10)
             | (byte)(uVar5 >> 0x10);
      }
      if (uVar8 + 1 < param_4) {
        *(char *)(param_3 + uVar8 + 1) = (char)(uVar5 >> 8);
      }
      uVar8 = uVar8 + 2;
    }
  }
  return uVar8;
}

Assistant:

size_t base64_decode(csubstr encoded, blob data)
{
    #define c4append_(c) { if(wpos < data.len) { data.buf[wpos] = static_cast<c4::byte>(c); } ++wpos; }
    #define c4appendval_(c, shift)\
    {\
        C4_XASSERT(c >= 0);\
        C4_XASSERT(size_t(c) < sizeof(detail::base64_char_to_sextet_));\
        val |= static_cast<uint32_t>(detail::base64_char_to_sextet_[(c)]) << ((shift) * 6);\
    }

    C4_ASSERT(base64_valid(encoded));
    C4_CHECK(encoded.len % 4 == 0);
    size_t wpos = 0;  // the write position
    const char *C4_RESTRICT d = encoded.str;
    constexpr const uint32_t full_byte = 0xff;
    // process every quartet of input 6 bits --> triplet of output bytes
    for(size_t rpos = 0; rpos < encoded.len; rpos += 4, d += 4)
    {
        if(d[2] == '=' || d[3] == '=') // skip the last quartet if it is padded
        {
            C4_ASSERT(d + 4 == encoded.str + encoded.len);
            break;
        }
        uint32_t val = 0;
        c4appendval_(d[3], 0);
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
        c4append_((val           ) & full_byte);
    }
    // deal with the last quartet when it is padded
    if(d == encoded.str + encoded.len)
        return wpos;
    if(d[2] == '=') // 2 padding chars
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        C4_ASSERT(d[3] == '=');
        uint32_t val = 0;
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
    }
    else if(d[3] == '=') // 1 padding char
    {
        C4_ASSERT(d + 4 == encoded.str + encoded.len);
        uint32_t val = 0;
        c4appendval_(d[2], 1);
        c4appendval_(d[1], 2);
        c4appendval_(d[0], 3);
        c4append_((val >> (2 * 8)) & full_byte);
        c4append_((val >> (1 * 8)) & full_byte);
    }
    return wpos;
    #undef c4append_
    #undef c4appendval_
}